

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O1

bool load_mpsLine(FILE *file,int *integerVar,int lmax,char *line,char *flag,double *data)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  ulong uVar12;
  double dVar13;
  int local_70;
  int iVar11;
  
  if (flag[1] == '\0') {
    do {
      pcVar3 = fgets(line,lmax,(FILE *)file);
      if (pcVar3 == (char *)0x0) {
        printf("load_mpsLine: fgets_rt = %s\n",0);
        return false;
      }
      sVar4 = strlen(line);
      iVar11 = (int)sVar4;
      iVar9 = iVar11 + -1;
      lVar8 = -0x16;
      iVar10 = 0;
      do {
        iVar6 = iVar10;
        iVar7 = (int)lVar8;
        iVar2 = isspace((int)line[lVar8 + (long)iVar9 + 0x16]);
        iVar10 = iVar6 + 1;
        lVar8 = lVar8 + -1;
        if (iVar7 + iVar9 + 0x16 < 0) break;
      } while (iVar2 != 0);
      iVar7 = 3;
      if ((0 < iVar11 - iVar10) && (*line != '*')) {
        uVar12 = sVar4 + lVar8 + 0x17;
        if ((int)uVar12 < 0x18) {
          memset(line + lVar8 + (sVar4 & 0xffffffff) + 0x17,0x20,
                 (ulong)(uint)-((int)lVar8 + iVar11) + 1);
          iVar10 = iVar9 - iVar6;
          do {
            iVar11 = iVar10;
            iVar10 = iVar11 + 1;
          } while (iVar10 < 0x17);
          uVar12 = (ulong)(iVar11 + 2);
        }
        iVar7 = 3;
        if ((int)uVar12 == 0x18) {
          line[0x18] = '0';
          uVar12 = 0x19;
        }
        line[uVar12 & 0xffffffff] = '\0';
        if (*line == ' ') {
          if ((((line[0xe] == '\'') && (line[0xf] == 'M')) && (line[0x10] == 'A')) &&
             (((line[0x11] == 'R' && (line[0x12] == 'K')) &&
              ((line[0x13] == 'E' && (line[0x14] == 'R')))))) {
            pcVar3 = line + (long)line[0x16] + 5;
            do {
              pcVar5 = pcVar3;
              pcVar3 = pcVar5 + 1;
            } while (pcVar5[-5] != '\'');
            if (pcVar5[-4] == 'I') {
              if (((pcVar5[-3] == 'N') && (pcVar5[-2] == 'T')) &&
                 ((pcVar5[-1] == 'O' && ((*pcVar5 == 'R' && (*pcVar3 == 'G')))))) {
                *integerVar = 1;
              }
              else if (((pcVar5[-3] == 'N') &&
                       (((pcVar5[-2] == 'T' && (pcVar5[-1] == 'E')) && (*pcVar5 == 'N')))) &&
                      (*pcVar3 == 'D')) {
                *integerVar = 0;
              }
            }
          }
          else {
            cVar1 = line[2];
            if (cVar1 == ' ') {
              cVar1 = line[1];
            }
            *flag = cVar1;
            data[1] = *(double *)(line + 4);
            data[2] = *(double *)(line + 0xe);
            dVar13 = atof(line + 0x18);
            *data = dVar13;
            iVar7 = 2;
            local_70 = (int)uVar12;
            if (0x27 < local_70) {
              flag[1] = '\x01';
            }
          }
        }
        else {
          *flag = *line;
          iVar7 = 1;
        }
      }
    } while (iVar7 == 3);
    if (iVar7 != 2) {
      return false;
    }
  }
  else {
    flag[1] = '\0';
    data[2] = *(double *)(line + 0x27);
    dVar13 = atof(line + 0x31);
    *data = dVar13;
  }
  return true;
}

Assistant:

bool load_mpsLine(FILE *file, int& integerVar, int lmax, char *line, char *flag, double *data) {
    int F1 = 1, F2 = 4, F3 = 14, F4 = 24, F5 = 39, F6 = 49;
    char *fgets_rt;

    // check the buffer
    if (flag[1]) {
        flag[1] = 0;
        memcpy(&data[2], &line[F5], 8);
        data[0] = atof(&line[F6]);
        return true;
    }

    // try to read some to the line
    for (;;) {
        // Line input
        fgets_rt = fgets(line, lmax, file);
	if (fgets_rt == NULL) {
	  printf("load_mpsLine: fgets_rt = %s\n", fgets_rt);
	  return false;
	}
        // Line trim   -- to delete tailing white spaces
        int lcnt = strlen(line) - 1;
        while (isspace(line[lcnt]) && lcnt >= 0)
            lcnt--;
        if (lcnt <= 0 || line[0] == '*')
            continue;

        // Line expand -- to get data easier
        lcnt++;
        while (lcnt < F4)
            line[lcnt++] = ' '; // For row and bound row name
        if (lcnt == F4)
            line[lcnt++] = '0'; // For bound value
        line[lcnt] = '\0';

        // Done with section symbol
        if (line[0] != ' ') {
            flag[0] = line[0];
            return false;
        }

        if (line[F3] == '\'') {
	  if (line[F3+1] == 'M' && line[F3+2] == 'A' && line[F3+3] == 'R' &&
	      line[F3+4] == 'K' && line[F3+5] == 'E' && line[F3+6] == 'R') {
	    int cnter = line[F3+8];
	    while (line[cnter] != '\'')
	      ++cnter;
	    if (line[cnter+1] == 'I' && line[cnter+2] == 'N' && line[cnter+3] == 'T' &&
		line[cnter+4] == 'O' && line[cnter+5] == 'R' && line[cnter+6] == 'G')
	      integerVar = 1;
	    else if (line[cnter+1] == 'I' && line[cnter+2] == 'N' && line[cnter+3] == 'T' &&
		     line[cnter+4] == 'E' && line[cnter+5] == 'N' && line[cnter+6] == 'D')
	      integerVar = 0;
	    continue;
	  }
        }

        // Read major symbol & name
	flag[0] = line[F1 + 1] == ' ' ? line[F1] : line[F1 + 1];
	memcpy(&data[1], &line[F2], 8);
        // Read 1st minor name & value to output
        memcpy(&data[2], &line[F3], 8);
        data[0] = atof(&line[F4]);

        // Keep 2nd minor name & value for future
        if (lcnt > F5)
            flag[1] = 1;
        break;
    }

    return true;
}